

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.h
# Opt level: O2

BBox * __thiscall CMU462::StaticScene::Sphere::get_bbox(BBox *__return_storage_ptr__,Sphere *this)

{
  double dVar1;
  Vector3D local_48;
  Vector3D local_28;
  
  local_48.y = this->r;
  local_48.z = (this->o).z;
  local_28.z = local_48.z - local_48.y;
  local_48.x = (this->o).x;
  dVar1 = (this->o).y;
  local_28.x = local_48.x - local_48.y;
  local_28.y = dVar1 - local_48.y;
  local_48.z = local_48.y + local_48.z;
  local_48.x = local_48.y + local_48.x;
  local_48.y = local_48.y + dVar1;
  BBox::BBox(__return_storage_ptr__,&local_28,&local_48);
  return __return_storage_ptr__;
}

Assistant:

BBox get_bbox() const {
    return BBox(o - Vector3D(r, r, r), o + Vector3D(r, r, r));
  }